

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_enum_impl(t_rs_generator *this,t_enum *tenum,string *enum_name)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  t_enum_value *local_e8;
  t_enum_value *val_1;
  t_enum_value **local_d8;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_d0;
  iterator constants_iter_1;
  string local_a8;
  string local_88;
  t_enum_value *local_58;
  t_enum_value *val;
  t_enum_value **local_48;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_40;
  iterator constants_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string *enum_name_local;
  t_enum *tenum_local;
  t_rs_generator *this_local;
  
  poVar3 = std::operator<<((ostream *)&this->f_gen_,"impl ");
  poVar3 = std::operator<<(poVar3,(string *)enum_name);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  __x = t_enum::get_constants(tenum);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&constants_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_40);
  local_48 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&constants_iter);
  local_40._M_current = local_48;
  while( true ) {
    val = (t_enum_value *)
          std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                    ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&constants_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                        *)&val);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_40);
    local_58 = *pptVar4;
    render_rustdoc(this,&local_58->super_t_doc);
    t_generator::indent_abi_cxx11_(&local_88,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_88);
    poVar3 = std::operator<<(poVar3,"pub const ");
    psVar5 = t_enum_value::get_name_abi_cxx11_(local_58);
    rust_enum_variant_name(&local_a8,this,psVar5);
    poVar3 = std::operator<<(poVar3,(string *)&local_a8);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,(string *)enum_name);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)enum_name);
    poVar3 = std::operator<<(poVar3,"(");
    iVar2 = t_enum_value::get_value(local_58);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,")");
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_40);
  }
  t_generator::indent_abi_cxx11_((string *)&constants_iter_1,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&constants_iter_1);
  poVar3 = std::operator<<(poVar3,"pub const ENUM_VALUES: &\'static [Self] = &[");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&constants_iter_1);
  t_generator::indent_up(&this->super_t_generator);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_d0);
  local_d8 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&constants_iter);
  local_d0._M_current = local_d8;
  while( true ) {
    val_1 = (t_enum_value *)
            std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                      ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&constants_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                        *)&val_1);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_d0);
    local_e8 = *pptVar4;
    t_generator::indent_abi_cxx11_(&local_108,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_108);
    poVar3 = std::operator<<(poVar3,"Self::");
    psVar5 = t_enum_value::get_name_abi_cxx11_(local_e8);
    rust_enum_variant_name(&local_128,this,psVar5);
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = std::operator<<(poVar3,",");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_d0);
  }
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_148,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_148);
  poVar3 = std::operator<<(poVar3,"];");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_168);
  poVar3 = std::operator<<(poVar3,"#[allow(clippy::trivially_copy_pass_by_ref)]");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  t_generator::indent_abi_cxx11_(&local_188,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_188);
  poVar3 = std::operator<<(poVar3,
                           "pub fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_188);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_1a8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1a8);
  poVar3 = std::operator<<(poVar3,"o_prot.write_i32(self.0)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a8);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_1c8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c8);
  t_generator::indent_abi_cxx11_(&local_1e8,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,
                           "pub fn read_from_in_protocol(i_prot: &mut dyn TInputProtocol) -> thrift::Result<"
                          );
  poVar3 = std::operator<<(poVar3,(string *)enum_name);
  poVar3 = std::operator<<(poVar3,"> {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e8);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_208,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_208);
  poVar3 = std::operator<<(poVar3,"let enum_value = i_prot.read_i32()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_208);
  t_generator::indent_abi_cxx11_(&local_228,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"Ok(");
  poVar3 = std::operator<<(poVar3,(string *)enum_name);
  poVar3 = std::operator<<(poVar3,"::from(enum_value)");
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_228);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_248,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_248);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_down(&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&constants_iter);
  return;
}

Assistant:

void t_rs_generator::render_enum_impl(t_enum* tenum, const string& enum_name) {
  f_gen_ << "impl " << enum_name << " {" << endl;
  indent_up();

  vector<t_enum_value*> constants = tenum->get_constants();

  // associated constants for each IDL-defined enum variant
  {
      vector<t_enum_value*>::iterator constants_iter;
      for (constants_iter = constants.begin(); constants_iter != constants.end(); ++constants_iter) {
        t_enum_value* val = (*constants_iter);
        render_rustdoc((t_doc*) val);
        f_gen_
            << indent()
            << "pub const " << rust_enum_variant_name(val->get_name()) << ": " << enum_name
            << " = "
            << enum_name << "(" << val->get_value() << ")"
            << ";"
            << endl;
      }
  }

  // array containing all IDL-defined enum variants
  {
    f_gen_ << indent() << "pub const ENUM_VALUES: &'static [Self] = &[" << endl;
    indent_up();
    vector<t_enum_value*>::iterator constants_iter;
    for (constants_iter = constants.begin(); constants_iter != constants.end(); ++constants_iter) {
      t_enum_value* val = (*constants_iter);
      f_gen_
          << indent()
          << "Self::" << rust_enum_variant_name(val->get_name())
          << ","
          << endl;
    }
    indent_down();
    f_gen_ << indent() << "];" << endl;
  }

  f_gen_ << indent() << "#[allow(clippy::trivially_copy_pass_by_ref)]" << endl;
  f_gen_
    << indent()
    << "pub fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
    << endl;
  indent_up();
  f_gen_ << indent() << "o_prot.write_i32(self.0)" << endl;
  indent_down();
  f_gen_ << indent() << "}" << endl;

  f_gen_
    << indent()
    << "pub fn read_from_in_protocol(i_prot: &mut dyn TInputProtocol) -> thrift::Result<" << enum_name << "> {"
    << endl;
  indent_up();
  f_gen_ << indent() << "let enum_value = i_prot.read_i32()?;" << endl;
  f_gen_ << indent() << "Ok(" << enum_name << "::from(enum_value)" << ")" << endl;
  indent_down();
  f_gen_ << indent() << "}" << endl;

  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}